

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

bool __thiscall TestRange<bool>::getEntry(TestRange<bool> *this,size_t idx)

{
  long in_RSI;
  int *in_RDI;
  double __x;
  __type _Var1;
  ssize_t _ret;
  ssize_t _step;
  ssize_t _begin;
  unsigned_long in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffc8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffd0;
  reference local_28 [2];
  bool local_1;
  
  if (*in_RDI == 1) {
    local_28[0] = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_1 = std::_Bit_reference::operator_cast_to_bool(local_28);
  }
  else if (*in_RDI == 2) {
    local_1 = (ulong)(*(byte *)(in_RDI + 0xc) & 1) +
              (ulong)(*(byte *)((long)in_RDI + 0x32) & 1) * in_RSI != 0;
  }
  else if (*in_RDI == 3) {
    __x = (double)(*(byte *)(in_RDI + 0xc) & 1);
    _Var1 = std::pow<long,unsigned_long>((long)__x,in_stack_ffffffffffffffa8);
    local_1 = (long)(__x * _Var1) != 0;
  }
  else {
    local_1 = (bool)(*(byte *)(in_RDI + 0xc) & 1);
  }
  return local_1;
}

Assistant:

T getEntry(size_t idx) {
        if (type == RangeType::ARRAY) {
            return (T)(array[idx]);
        } else if (type == RangeType::LINEAR) {
            return (T)(begin + step * idx);
        } else if (type == RangeType::EXPONENTIAL) {
            ssize_t _begin = begin;
            ssize_t _step = step;
            ssize_t _ret = (ssize_t)( _begin * std::pow(_step, idx) );
            return (T)(_ret);
        }

        return begin;
    }